

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O1

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* GetStringTokens(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *__return_storage_ptr__,string_view *signature)

{
  pointer *ppbVar1;
  byte bVar2;
  iterator iVar3;
  pointer pbVar4;
  bool bVar5;
  ostream *poVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar10 = 0;
  uVar9 = 0;
  bVar5 = false;
  do {
    if (bVar5) {
      bVar2 = signature->_M_str[lVar10];
      bVar5 = false;
      if (((bVar2 - 99 < 0x11) && ((0x1004bU >> (bVar2 - 99 & 0x1f) & 1) != 0)) || (bVar2 == 0)) {
        local_40._M_len = CONCAT71(local_40._M_len._1_7_,bVar2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_40,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," found after % at ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", making substr(",0x10);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        uVar11 = ~uVar9 + lVar10;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"substr = ",9);
        uVar8 = signature->_M_len - uVar9;
        if (signature->_M_len < uVar9) goto LAB_0010384c;
        if (uVar11 <= uVar8) {
          uVar8 = uVar11;
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,signature->_M_str + uVar9,uVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        uVar8 = signature->_M_len - uVar9;
        if (signature->_M_len < uVar9) goto LAB_00103864;
        local_40._M_len = uVar11;
        if (uVar8 < uVar11) {
          local_40._M_len = uVar8;
        }
        local_40._M_str = signature->_M_str + uVar9;
        iVar3._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)__return_storage_ptr__,iVar3,&local_40);
        }
        else {
          (iVar3._M_current)->_M_len = local_40._M_len;
          (iVar3._M_current)->_M_str = local_40._M_str;
          ppbVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
        uVar9 = lVar10 + 1;
      }
    }
    else if (signature->_M_str[lVar10] == '%') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% found at ",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      bVar5 = true;
      std::ostream::flush();
    }
    else {
      bVar5 = false;
      if (signature->_M_str[lVar10] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"str ends at ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", making substr(",0x10);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        uVar11 = lVar10 - uVar9;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"substr = ",9);
        uVar8 = signature->_M_len - uVar9;
        if (signature->_M_len < uVar9) {
LAB_0010384c:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar9);
LAB_00103864:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar9);
        }
        else {
          if (uVar11 <= uVar8) {
            uVar8 = uVar11;
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,signature->_M_str + uVar9,uVar8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          uVar8 = signature->_M_len - uVar9;
          if (uVar9 <= signature->_M_len) {
            local_40._M_len = uVar11;
            if (uVar8 < uVar11) {
              local_40._M_len = uVar8;
            }
            local_40._M_str = signature->_M_str + uVar9;
            iVar3._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)__return_storage_ptr__,iVar3,&local_40);
            }
            else {
              (iVar3._M_current)->_M_len = local_40._M_len;
              (iVar3._M_current)->_M_str = local_40._M_str;
              ppbVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppbVar1 = *ppbVar1 + 1;
            }
            return __return_storage_ptr__;
          }
        }
        uVar7 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar9);
        pbVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar4 != (pointer)0x0) {
          operator_delete(pbVar4,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pbVar4);
        }
        _Unwind_Resume(uVar7);
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

std::vector<std::string_view> GetStringTokens(const std::string_view& signature) {
    std::vector<std::string_view> token_vector;
    _tokenizer_state state = TNORMAL;
    size_t idx_start = 0, idx = 0;
    while (true) {
        if (state == TNORMAL) {
            if (signature[idx] == '%') {
                std::cout << "% found at " << idx << std::endl;
                state = TPERC;
            } else if (signature[idx] == '\0') {
                std::cout << "str ends at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start));
                break;
            }
            ++idx;
        } else {
            state = TNORMAL;
            switch (signature[idx]) {
            case 's':
            case 'c':
            case 'i':
            case 'd':
            case 'f':
            case '\0':
                std::cout << signature[idx] << " found after % at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start - 1 << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start - 1) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start - 1));
                idx_start = idx + 1;
                break;
            default:
                break;
            }
            ++idx;
        }
    }

    return token_vector;
}